

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGTextFragmentsBuilder::SVGTextFragmentsBuilder
          (SVGTextFragmentsBuilder *this,u32string *text,SVGTextFragmentList *fragments)

{
  _Rb_tree_header *p_Var1;
  pointer pSVar2;
  
  this->m_text = text;
  this->m_fragments = fragments;
  p_Var1 = &(this->m_characterPositions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_characterPositions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_characterPositions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_characterPositions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_characterPositions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_characterPositions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_textPositions).
  super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textPositions).
  super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textPositions).
  super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_characterOffset = 0;
  this->m_x = 0.0;
  this->m_y = 0.0;
  text->_M_string_length = 0;
  *(text->_M_dataplus)._M_p = L'\0';
  pSVar2 = (fragments->
           super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((fragments->
      super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>).
      _M_impl.super__Vector_impl_data._M_finish != pSVar2) {
    (fragments->
    super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>)._M_impl
    .super__Vector_impl_data._M_finish = pSVar2;
  }
  return;
}

Assistant:

SVGTextFragmentsBuilder::SVGTextFragmentsBuilder(std::u32string& text, SVGTextFragmentList& fragments)
    : m_text(text), m_fragments(fragments)
{
    m_text.clear();
    m_fragments.clear();
}